

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangulation.cpp
# Opt level: O3

bool __thiscall
TRM::Triangulation::check_intersection
          (Triangulation *this,Edge *left,Edge *right,ActiveEdgeList *ael,Vertex **current)

{
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 *paVar1;
  float fVar2;
  vec2 vVar3;
  Triangulation *this_00;
  bool bVar4;
  VertexList *pVVar5;
  Vertex *pVVar6;
  Vertex *pVVar7;
  Vertex *next;
  bool bVar8;
  Vertex **current_00;
  vec2 p;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_50;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 aStack_4c;
  Vertex *local_48;
  Triangulation *local_40;
  ActiveEdgeList *local_38;
  Vertex *ael_00;
  
  bVar8 = right == (Edge *)0x0 || left == (Edge *)0x0;
  ael_00 = (Vertex *)CONCAT71((int7)((ulong)ael >> 8),bVar8);
  if (bVar8) {
    return false;
  }
  current_00 = current;
  bVar8 = Edge::intersect(left,right,(vec2 *)&local_50);
  if (((!bVar8) || (((uint)local_50 & 0x7fffffff) == 0x7f800000)) ||
     (((uint)aStack_4c & 0x7fffffff) == 0x7f800000)) {
    bVar8 = intersect_pair_edge(this,left,right,ael,current);
    return bVar8;
  }
  pVVar7 = *current;
  local_40 = this;
  local_38 = ael;
  if (pVVar7 == (Vertex *)0x0) {
    pVVar7 = (Vertex *)0x0;
  }
  else {
    do {
      bVar8 = VertexCompare::Compare((vec2 *)&local_50,&pVVar7->point);
      if (!bVar8) goto LAB_0011ab99;
      pVVar7 = pVVar7->prev;
    } while (pVVar7 != (Vertex *)0x0);
    pVVar7 = (Vertex *)0x0;
  }
LAB_0011ab99:
  next = left->top;
  if ((local_50.x == (next->point).field_0.x) && (!NAN(local_50.x) && !NAN((next->point).field_0.x))
     ) {
    paVar1 = &(next->point).field_1;
    if ((aStack_4c.y == paVar1->y) && (!NAN(aStack_4c.y) && !NAN(paVar1->y))) goto LAB_0011ad06;
  }
  next = left->bottom;
  if ((local_50.x == (next->point).field_0.x) && (!NAN(local_50.x) && !NAN((next->point).field_0.x))
     ) {
    paVar1 = &(next->point).field_1;
    if ((aStack_4c.y == paVar1->y) && (!NAN(aStack_4c.y) && !NAN(paVar1->y))) goto LAB_0011ad06;
  }
  next = right->top;
  if ((local_50.x == (next->point).field_0.x) && (!NAN(local_50.x) && !NAN((next->point).field_0.x))
     ) {
    paVar1 = &(next->point).field_1;
    if ((aStack_4c.y == paVar1->y) && (!NAN(aStack_4c.y) && !NAN(paVar1->y))) goto LAB_0011ad06;
  }
  next = right->bottom;
  if ((local_50.x == (next->point).field_0.x) && (!NAN(local_50.x) && !NAN((next->point).field_0.x))
     ) {
    paVar1 = &(next->point).field_1;
    if ((aStack_4c.y == paVar1->y) && (!NAN(aStack_4c.y) && !NAN(paVar1->y))) goto LAB_0011ad06;
  }
  for (; pVVar7 != (Vertex *)0x0; pVVar7 = pVVar7->prev) {
    bVar8 = VertexCompare::Compare((vec2 *)&local_50,&pVVar7->point);
    if (!bVar8) {
      pVVar5 = (VertexList *)&pVVar7->next;
      local_48 = pVVar7;
      goto LAB_0011ac39;
    }
  }
  pVVar5 = &local_40->mesh_;
  local_48 = (Vertex *)0x0;
LAB_0011ac39:
  pVVar7 = (pVVar5->super_LinkedList<TRM::Vertex>).head;
  bVar8 = pVVar7 == (Vertex *)0x0;
  pVVar6 = local_48;
  if (bVar8) {
    pVVar7 = (Vertex *)0x0;
LAB_0011ac6e:
    pVVar6 = local_48;
    if (local_48 != (Vertex *)0x0) goto LAB_0011ac84;
    pVVar6 = (Vertex *)0x0;
  }
  else {
    do {
      local_48 = pVVar6;
      pVVar6 = pVVar7;
      bVar4 = VertexCompare::Compare(&pVVar6->point,(vec2 *)&local_50);
      pVVar7 = pVVar6;
      if (!bVar4) goto LAB_0011ac6e;
      pVVar7 = pVVar6->next;
    } while (pVVar6->next != (Vertex *)0x0);
    bVar8 = true;
    pVVar7 = (Vertex *)0x0;
LAB_0011ac84:
    fVar2 = (pVVar6->point).field_0.x;
    if ((fVar2 == local_50.x) && (!NAN(fVar2) && !NAN(local_50.x))) {
      fVar2 = (pVVar6->point).field_1.y;
      if ((fVar2 == aStack_4c.y) && (next = pVVar6, !NAN(fVar2) && !NAN(aStack_4c.y)))
      goto LAB_0011ad06;
    }
  }
  next = pVVar7;
  if ((((bVar8) || (fVar2 = (next->point).field_0.x, fVar2 != local_50.x)) ||
      (NAN(fVar2) || NAN(local_50.x))) ||
     ((fVar2 = (next->point).field_1.y, fVar2 != aStack_4c.y || (NAN(fVar2) || NAN(aStack_4c.y)))))
  {
    local_48 = pVVar6;
    pVVar7 = ObjectHeap::Allocate<TRM::Vertex,glm::vec<2,float,(glm::qualifier)0>&>
                       (&local_40->heap_,(vec<2,_float,_(glm::qualifier)0> *)&local_50);
    vVar3.field_1.y = aStack_4c.y;
    vVar3.field_0.x = local_50.x;
    pVVar7->point = vVar3;
    ael_00 = next;
    VertexList::insert(&local_40->mesh_,pVVar7,local_48,next);
    next = pVVar7;
  }
LAB_0011ad06:
  ActiveEdgeList::rewind(local_38,(FILE *)current);
  this_00 = local_40;
  split_edge(local_40,left,next,(ActiveEdgeList *)ael_00,current_00);
  split_edge(this_00,right,next,(ActiveEdgeList *)ael_00,current_00);
  return true;
}

Assistant:

bool Triangulation::check_intersection(Edge* left, Edge* right,
                                       ActiveEdgeList* ael, Vertex** current) {
  if (!left || !right) {
    return false;
  }

  glm::vec2 p;

  if (left->intersect(right, &p) && !glm::isinf(p.x) && !glm::isinf(p.y)) {
    Vertex* v;
    Vertex* top = *current;

    // the vertex in mesh is sorted, so walk to prev can find latest top point
    while (top && VertexCompare::Compare(p, top->point)) {
      top = top->prev;
    }

    if (p == left->top->point) {
      v = left->top;
    } else if (p == left->bottom->point) {
      v = left->bottom;
    } else if (p == right->top->point) {
      v = right->top;
    } else if (p == right->bottom->point) {
      v = right->bottom;
    } else {
      // intersect point is between start and end point
      // need to insert new vertex
      auto prev = top;
      while (prev && VertexCompare::Compare(p, prev->point)) {
        prev = prev->prev;
      }

      auto next = prev ? prev->next : mesh_.head;
      while (next && VertexCompare::Compare(next->point, p)) {
        prev = next;
        next = next->next;
      }

      // check if point is already in mesh
      if (prev && prev->point == p) {
        v = prev;
      } else if (next && next->point == p) {
        v = next;
      } else {
        v = heap_.Allocate<Vertex>(p);
        v->point = p;

        mesh_.insert(v, prev, next);
      }
    }
    ael->rewind(current, top ? top : v);

    split_edge(left, v, ael, current);
    split_edge(right, v, ael, current);
    return true;
  }

  return intersect_pair_edge(left, right, ael, current);
}